

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

void testing::internal::PrintCharsAsStringTo(char *begin,size_t len,ostream *os)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  if (len != 0) {
    sVar1 = 0;
    do {
      PrintAsWideStringLiteralTo((uint)(byte)begin[sVar1],os);
      sVar1 = sVar1 + 1;
    } while (len != sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  return;
}

Assistant:

static void PrintCharsAsStringTo(const char* begin, size_t len, ostream* os) {
  *os << "\"";
  for (size_t index = 0; index < len; ++index) {
    PrintAsStringLiteralTo(begin[index], os);
  }
  *os << "\"";
}